

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O1

void pd_floatforsignal(t_pd *x,t_float f)

{
  long lVar1;
  
  lVar1 = (long)(*x)->c_floatsignalin;
  if (0 < lVar1) {
    *(t_float *)((long)x + lVar1) = f;
    return;
  }
  pd_error(x,"%s: float unexpected for signal input",(*x)->c_name->s_name);
  return;
}

Assistant:

static void pd_floatforsignal(t_pd *x, t_float f)
{
    int offset = (*x)->c_floatsignalin;
    if (offset > 0)
        *(t_float *)(((char *)x) + offset) = f;
    else
        pd_error(x, "%s: float unexpected for signal input",
            (*x)->c_name->s_name);
}